

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O0

string * __thiscall CECorrections::LoadFile(CECorrections *this,string *filename,string *url)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  exception *this_00;
  undefined8 uVar4;
  string *in_RDX;
  string *in_RDI;
  string msg;
  ifstream *corrections_file;
  string *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  allocator *paVar5;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  allocator in_stack_ffffffffffffff87;
  char *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  corr_file_load_error *in_stack_ffffffffffffffa0;
  
  std::ifstream::ifstream(in_RDI,in_RDX,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::ifstream::close();
    bVar2 = DownloadTable((CECorrections *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    if (!bVar2) {
      this_00 = (exception *)__cxa_allocate_exception(8);
      std::exception::exception(this_00);
      __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
    }
    std::ifstream::open(in_RDI,(_Ios_Openmode)in_RDX);
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      std::operator+(in_stack_ffffffffffffff88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,
                                       CONCAT15(bVar1,in_stack_ffffffffffffff80))));
      uVar4 = __cxa_allocate_exception(0xa8);
      paVar5 = (allocator *)&stack0xffffffffffffff87;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff88,"LoadFile",paVar5);
      CEException::corr_file_load_error::corr_file_load_error
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      __cxa_throw(uVar4,&CEException::corr_file_load_error::typeinfo,
                  CEException::corr_file_load_error::~corr_file_load_error);
    }
  }
  return in_RDI;
}

Assistant:

std::ifstream CECorrections::LoadFile(const std::string& filename,
                                      const std::string& url) const
{
    // Check if the file has been stored
    std::ifstream corrections_file(filename, std::ios::in);

    // Try downloading the file
    if (!corrections_file.is_open()) {
        // Close the file so there's no funny business while attempting
        // to write to it
        corrections_file.close();

        // Try downloading the correction files
        if (!DownloadTable(filename, url)) {
            throw CEException::exception();
        }

        // Try to open the file again
        corrections_file.open(filename, std::ios::in);

        // Make sure the file is open
        if (!corrections_file.is_open()) {
            std::string msg = "Unable to load corrections file: " + filename;
            throw CEException::corr_file_load_error(__func__, msg);
        }
    }

    return corrections_file;
}